

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O0

uint __thiscall llvm::SourceMgr::SrcBuffer::getLineNumber<unsigned_int>(SrcBuffer *this,char *Ptr)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  size_t sVar4;
  pointer pMVar5;
  char *pcVar6;
  ulong uVar7;
  difference_type dVar8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_70;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_68;
  uint local_5c;
  ulong uStack_58;
  uint PtrOffset;
  ptrdiff_t PtrDiff;
  char *BufStart;
  size_t local_40;
  size_t N;
  StringRef S;
  size_t Sz;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *Offsets;
  char *Ptr_local;
  SrcBuffer *this_local;
  
  bVar1 = PointerUnion<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>
          ::isNull(&this->OffsetCache);
  if (bVar1) {
    Sz = (size_t)operator_new(0x18);
    memset((void *)Sz,0,0x18);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)Sz);
    pointer_union_detail::
    PointerUnionMembers<llvm::PointerUnion<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_llvm::PointerIntPair<void_*,_2U,_int,_llvm::pointer_union_detail::PointerUnionUIntTraits<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_llvm::PointerIntPairInfo<void_*,_2U,_llvm::pointer_union_detail::PointerUnionUIntTraits<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>,_2,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>
    ::operator=((PointerUnionMembers<llvm::PointerUnion<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_llvm::PointerIntPair<void_*,_2U,_int,_llvm::pointer_union_detail::PointerUnionUIntTraits<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_llvm::PointerIntPairInfo<void_*,_2U,_llvm::pointer_union_detail::PointerUnionUIntTraits<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>,_2,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>
                 *)&this->OffsetCache,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)Sz);
    pMVar5 = std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::
             operator->(&this->Buffer);
    sVar4 = MemoryBuffer::getBufferSize(pMVar5);
    S.Length = sVar4;
    uVar3 = std::numeric_limits<unsigned_int>::max();
    if (uVar3 < sVar4) {
      __assert_fail("Sz <= std::numeric_limits<T>::max()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/SourceMgr.cpp"
                    ,0x51,
                    "unsigned int llvm::SourceMgr::SrcBuffer::getLineNumber(const char *) const [T = unsigned int]"
                   );
    }
    pMVar5 = std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::
             operator->(&this->Buffer);
    _N = MemoryBuffer::getBuffer(pMVar5);
    for (local_40 = 0; local_40 < S.Length; local_40 = local_40 + 1) {
      cVar2 = StringRef::operator[]((StringRef *)&N,local_40);
      if (cVar2 == '\n') {
        BufStart._4_4_ = (undefined4)local_40;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)Sz,
                   (value_type_conflict2 *)((long)&BufStart + 4));
      }
    }
  }
  else {
    Sz = (size_t)PointerUnion<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>
                 ::get<std::vector<unsigned_int,std::allocator<unsigned_int>>*>
                           ((PointerUnion<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>
                             *)&this->OffsetCache);
  }
  pMVar5 = std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::operator->
                     (&this->Buffer);
  PtrDiff = (ptrdiff_t)MemoryBuffer::getBufferStart(pMVar5);
  bVar1 = false;
  if ((ulong)PtrDiff <= Ptr) {
    pMVar5 = std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::
             operator->(&this->Buffer);
    pcVar6 = MemoryBuffer::getBufferEnd(pMVar5);
    bVar1 = Ptr <= pcVar6;
  }
  if (bVar1) {
    uVar7 = (long)Ptr - PtrDiff;
    bVar1 = false;
    uStack_58 = uVar7;
    if (-1 < (long)uVar7) {
      uVar3 = std::numeric_limits<unsigned_int>::max();
      bVar1 = uVar7 <= uVar3;
    }
    if (bVar1) {
      local_5c = (uint)uStack_58;
      local_68._M_current =
           (uint *)lower_bound<std::vector<unsigned_int,std::allocator<unsigned_int>>&,unsigned_int&>
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)Sz,&local_5c);
      local_70._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)Sz);
      dVar8 = __gnu_cxx::operator-(&local_68,&local_70);
      return (int)dVar8 + 1;
    }
    __assert_fail("PtrDiff >= 0 && static_cast<size_t>(PtrDiff) <= std::numeric_limits<T>::max()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/SourceMgr.cpp"
                  ,0x5f,
                  "unsigned int llvm::SourceMgr::SrcBuffer::getLineNumber(const char *) const [T = unsigned int]"
                 );
  }
  __assert_fail("Ptr >= BufStart && Ptr <= Buffer->getBufferEnd()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/SourceMgr.cpp"
                ,0x5d,
                "unsigned int llvm::SourceMgr::SrcBuffer::getLineNumber(const char *) const [T = unsigned int]"
               );
}

Assistant:

unsigned SourceMgr::SrcBuffer::getLineNumber(const char *Ptr) const {

  // Ensure OffsetCache is allocated and populated with offsets of all the
  // '\n' bytes.
  std::vector<T> *Offsets = nullptr;
  if (OffsetCache.isNull()) {
    Offsets = new std::vector<T>();
    OffsetCache = Offsets;
    size_t Sz = Buffer->getBufferSize();
    assert(Sz <= std::numeric_limits<T>::max());
    StringRef S = Buffer->getBuffer();
    for (size_t N = 0; N < Sz; ++N) {
      if (S[N] == '\n') {
        Offsets->push_back(static_cast<T>(N));
      }
    }
  } else {
    Offsets = OffsetCache.get<std::vector<T> *>();
  }

  const char *BufStart = Buffer->getBufferStart();
  assert(Ptr >= BufStart && Ptr <= Buffer->getBufferEnd());
  ptrdiff_t PtrDiff = Ptr - BufStart;
  assert(PtrDiff >= 0 && static_cast<size_t>(PtrDiff) <= std::numeric_limits<T>::max());
  T PtrOffset = static_cast<T>(PtrDiff);

  // llvm::lower_bound gives the number of EOL before PtrOffset. Add 1 to get
  // the line number.
  return llvm::lower_bound(*Offsets, PtrOffset) - Offsets->begin() + 1;
}